

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

Values * __thiscall
Executor::loadInitial(Values *__return_storage_ptr__,Executor *this,uint numberOfUnits)

{
  uint uVar1;
  ostream *poVar2;
  reference pvVar3;
  const_reference pvVar4;
  runtime_error *this_00;
  uint local_30;
  uint i;
  allocator<unsigned_int> local_1e;
  undefined1 local_1d;
  uint local_1c;
  Executor *pEStack_18;
  uint numberOfUnits_local;
  Executor *this_local;
  Values *initial;
  
  local_1d = 0;
  local_1c = numberOfUnits;
  pEStack_18 = this;
  this_local = (Executor *)__return_storage_ptr__;
  std::allocator<unsigned_int>::allocator(&local_1e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)numberOfUnits,&local_1e);
  std::allocator<unsigned_int>::~allocator(&local_1e);
  local_30 = 0;
  while( true ) {
    if (local_1c <= local_30) {
      return __return_storage_ptr__;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Insert initial state of ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30 + 1);
    std::operator<<(poVar2,". unit:\n> ");
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)local_30);
    std::istream::operator>>((istream *)&std::cin,pvVar3);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)local_30);
    uVar1 = *pvVar3;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_sizes,(ulong)local_30);
    if (*pvVar4 < uVar1) break;
    local_30 = local_30 + 1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Initial value is bigger than units size.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Values Executor::loadInitial(const unsigned int numberOfUnits) const
{
    Values initial(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        std::cout << "Insert initial state of " << (i + 1) << ". unit:\n> ";
        std::cin >> initial[i];
        if (initial[i] > m_sizes[i])
            throw std::runtime_error("Initial value is bigger than units size.");
    }

    return initial;
}